

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile_property.c
# Opt level: O0

int setHistfile(mpt_logfile *log,mpt_convertable *src)

{
  int iVar1;
  int local_34;
  FILE *pFStack_30;
  int sock;
  FILE *fd;
  char *where;
  mpt_convertable *src_local;
  mpt_logfile *log_local;
  
  fd = (FILE *)0x0;
  local_34 = -1;
  if ((log->state & 0x10) != 0) {
    return -0x21;
  }
  where = (char *)src;
  src_local = (mpt_convertable *)log;
  if (src == (mpt_convertable *)0x0) {
    pFStack_30 = (FILE *)0x0;
  }
  else {
    iVar1 = (*src->_vptr->convert)(src,1,&local_34);
    if (iVar1 < 0) {
      iVar1 = (*(code *)**(undefined8 **)where)(where,0x73,&fd);
      if (iVar1 < 0) {
        return -3;
      }
      pFStack_30 = (FILE *)0x0;
      if ((fd != (FILE *)0x0) && (pFStack_30 = fopen((char *)fd,"w"), pFStack_30 == (FILE *)0x0)) {
        return -1;
      }
    }
    else if (local_34 < 0) {
      pFStack_30 = (FILE *)0x0;
    }
    else {
      local_34 = dup(local_34);
      if (local_34 < 0) {
        return -4;
      }
      pFStack_30 = fdopen(local_34,"w");
      if (pFStack_30 == (FILE *)0x0) {
        close(local_34);
        return -1;
      }
    }
  }
  if (((src_local->_vptr != (_mpt_vptr_convertable *)0x0) && (src_local->_vptr != _stdout)) &&
     (src_local->_vptr != _stderr)) {
    fclose((FILE *)src_local->_vptr);
  }
  src_local->_vptr = (_mpt_vptr_convertable *)pFStack_30;
  return 0;
}

Assistant:

static int setHistfile(MPT_STRUCT(logfile) *log, MPT_INTERFACE(convertable) *src)
{
	const char *where = 0;
	FILE *fd;
	int sock = -1;
	
	if (log->state & MPT_OUTFLAG(Active)) {
		return MPT_MESGERR(InProgress);
	}
	/* default output */
	if (!src) {
		fd = 0;
	}
	/* use socket descriptor */
	else if (src->_vptr->convert(src, MPT_ENUM(TypeUnixSocket), &sock) >= 0) {
		if (sock < 0) {
			fd = 0;
		}
		else if ((sock = dup(sock)) < 0) {
			return MPT_ERROR(BadOperation);
		}
		else if (!(fd = fdopen(sock, "w"))) {
			close(sock);
			return MPT_ERROR(BadArgument);
		}
	}
	/* use file path */
	else if (src->_vptr->convert(src, 's', &where) >= 0) {
		fd = 0;
		/* regular file path */
		if (where && !(fd = fopen(where, "w"))) {
			return MPT_ERROR(BadArgument);
		}
	}
	else {
		return MPT_ERROR(BadType);
	}
	if (log->file && (log->file != stdout) && (log->file != stderr)) {
		fclose(log->file);
	}
	log->file = fd;
	
	return 0;
}